

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uchar *puVar2;
  undefined8 uVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32 _e_1;
  uint32 p_1;
  bool bVar8;
  vector<unsigned_int> remapped_endpoints;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec local_c8;
  
  vector<unsigned_int>::vector(&remapped_endpoints,(this->m_color_endpoints).m_size);
  for (uVar4 = 0; uVar4 < (this->m_color_endpoints).m_size; uVar4 = uVar4 + 1) {
    uVar5 = (this->m_color_endpoints).m_p[uVar4];
    remapped_endpoints.m_p[remapping->m_p[uVar4]] = uVar5 >> 3 & 0x1f1f1f | uVar5 & 0x7000000;
  }
  vector<unsigned_int>::vector(&hist.m_hist,0x20);
  uVar5 = 0;
  for (uVar4 = 0; uVar4 < remapped_endpoints.m_size; uVar4 = uVar4 + 1) {
    uVar1 = remapped_endpoints.m_p[uVar4];
    iVar6 = 4;
    uVar7 = uVar1;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      hist.m_hist.m_p[uVar7 - uVar5 & 0x1f] = hist.m_hist.m_p[uVar7 - uVar5 & 0x1f] + 1;
      uVar5 = uVar5 >> 8;
      uVar7 = uVar7 >> 8;
    }
    uVar5 = uVar1;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&dm,false,(static_huffman_data_model *)0x0);
  uVar5 = 0;
  for (uVar4 = 0; uVar4 < remapped_endpoints.m_size; uVar4 = uVar4 + 1) {
    uVar1 = remapped_endpoints.m_p[uVar4];
    iVar6 = 4;
    uVar7 = uVar1;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      symbol_codec::encode(&local_c8,uVar7 - uVar5 & 0x1f,&dm);
      uVar5 = uVar5 >> 8;
      uVar7 = uVar7 >> 8;
    }
    uVar5 = uVar1;
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar2 = packed_data->m_p;
  packed_data->m_p = local_c8.m_output_buf.m_p;
  uVar3._0_4_ = packed_data->m_size;
  uVar3._4_4_ = packed_data->m_capacity;
  packed_data->m_size = local_c8.m_output_buf.m_size;
  packed_data->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar2;
  local_c8.m_output_buf._8_8_ = uVar3;
  symbol_codec::~symbol_codec(&local_c8);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_int>::~vector(&remapped_endpoints);
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
  for (uint i = 0; i < m_color_endpoints.size(); i++)
    remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);

  symbol_histogram hist(32);
  for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++) {
    for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
      hist.inc_freq((e - _e) & 0x1F);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++) {
    for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
      codec.encode((e - _e) & 0x1F, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}